

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

acCode readAC(FILE *f,uchar number)

{
  uint uVar1;
  byte bVar2;
  bool bVar3;
  bool bVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  byte bVar9;
  uint uVar10;
  
  bVar2 = matchHuff(f,number,'\x01');
  uVar5 = (ulong)bVar2;
  uVar6 = uVar5;
  uVar7 = uVar5;
  if (bVar2 != 0) {
    if (bVar2 == 0xf0) {
      uVar5 = 0;
      uVar6 = 0x1000;
      uVar7 = 0;
    }
    else {
      bVar9 = bVar2 & 0xf;
      bVar3 = getBit(f);
      uVar10 = 1;
      if (1 < bVar9) {
        iVar8 = bVar9 - 1;
        uVar10 = 1;
        do {
          bVar4 = getBit(f);
          uVar10 = (uint)(bVar4 == bVar3) + uVar10 * 2;
          iVar8 = iVar8 + -1;
        } while (iVar8 != 0);
      }
      uVar1 = -uVar10;
      if (bVar3) {
        uVar1 = uVar10;
      }
      uVar5 = (ulong)uVar1 << 0x20;
      uVar6 = (ulong)(bVar2 >> 4) << 8;
      uVar7 = (ulong)bVar9;
    }
  }
  return (acCode)(uVar7 | uVar6 | uVar5);
}

Assistant:

acCode readAC(FILE *f, unsigned char number) {
    unsigned char x = matchHuff(f, number, AC);
    unsigned char zeros = x >> 4;
    unsigned char codeLen = x & 0x0F;
    if (x == 0) {
        return acCode{0,0,0};
    } else if (x == 0xF0) {
        return acCode{0, 16, 0};
    }
    unsigned  char first = getBit(f);
    int code = 1;
    for (int i = 1; i < codeLen; i++) {
        unsigned char b = getBit(f);
        code = code << 1;
        code += first ? b : !b;
    }
    code = first ? code : -code;
//    printf("read AC: %d %d %d\n", codeLen, zeros, code);
    return acCode{codeLen, zeros, code};
}